

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Cloner::RetargetClonedBranches(Cloner *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  BranchInstr *this_01;
  Instr **ppIVar5;
  Instr *pIVar6;
  
  if (this->fRetargetClonedBranch != 0) {
    if (this->instrLast == (Instr *)0x0) {
      pIVar6 = (Instr *)0x0;
    }
    else {
      pIVar6 = this->instrLast->m_next;
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    ppIVar5 = &this->instrFirst;
    pIVar4 = (Instr *)0x0;
    while (this_00 = *ppIVar5, this_00 != pIVar6) {
      if ((pIVar4 != (Instr *)0x0) && (pIVar4->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x78d,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      if (this_00->m_kind == InstrKindBranch) {
        this_01 = IR::Instr::AsBranchInstr(this_00);
        IR::BranchInstr::RetargetClonedBranch(this_01);
      }
      pIVar4 = this_00;
      ppIVar5 = &this_00->m_next;
    }
  }
  return;
}

Assistant:

void
Cloner::RetargetClonedBranches()
{
    if (!this->fRetargetClonedBranch)
    {
        return;
    }

    FOREACH_INSTR_IN_RANGE(instr, this->instrFirst, this->instrLast)
    {
        if (instr->IsBranchInstr())
        {
            instr->AsBranchInstr()->RetargetClonedBranch();
        }
    }
    NEXT_INSTR_IN_RANGE;
}